

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O3

void __thiscall
Js::ScriptContext::SetBuiltInLibraryFunction
          (ScriptContext *this,JavascriptMethod entryPoint,JavascriptFunction *function)

{
  Type *addr;
  JavascriptLibrary *pJVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Recycler *pRVar5;
  BaseDictionary<void_*(*)(Js::RecyclableObject_*,_Js::CallInfo,____),_Js::JavascriptFunction_*,_Memory::Recycler,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  BuiltInLibraryFunctionMap *this_01;
  undefined1 local_60 [8];
  TrackAllocData data;
  JavascriptMethod entryPoint_local;
  JavascriptFunction *function_local;
  
  if ((this->super_ScriptContextBase).isClosed == false) {
    this_01 = this->builtInLibraryFunctions;
    data._32_8_ = entryPoint;
    entryPoint_local = (JavascriptMethod)function;
    if (this_01 == (BuiltInLibraryFunctionMap *)0x0) {
      pRVar5 = this->recycler;
      if (pRVar5 == (Recycler *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                    ,0x14ba,"(this->recycler)","this->recycler");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar4 = 0;
        pRVar5 = this->recycler;
      }
      local_60 = (undefined1  [8])
                 &JsUtil::
                  BaseDictionary<void*(*)(Js::RecyclableObject*,Js::CallInfo,...),Js::JavascriptFunction*,Memory::Recycler,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  ::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_2d7f97f;
      data.filename._0_4_ = 0x14bc;
      pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,(TrackAllocData *)local_60);
      this_00 = (BaseDictionary<void_*(*)(Js::RecyclableObject_*,_Js::CallInfo,____),_Js::JavascriptFunction_*,_Memory::Recycler,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 *)new<Memory::Recycler>(0x38,pRVar5,0x387914);
      JsUtil::
      BaseDictionary<void_*(*)(Js::RecyclableObject_*,_Js::CallInfo,_...),_Js::JavascriptFunction_*,_Memory::Recycler,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::BaseDictionary(this_00,this->recycler,0x83);
      this->builtInLibraryFunctions = this_00;
      pJVar1 = (this->super_ScriptContextBase).javascriptLibrary;
      addr = &(pJVar1->cache).builtInLibraryFunctions;
      Memory::Recycler::WBSetBit((char *)addr);
      (pJVar1->cache).builtInLibraryFunctions.ptr = this_00;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      this_01 = this->builtInLibraryFunctions;
    }
    JsUtil::
    BaseDictionary<void*(*)(Js::RecyclableObject*,Js::CallInfo,...),Js::JavascriptFunction*,Memory::Recycler,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<void*(*)(Js::RecyclableObject*,Js::CallInfo,___),Js::JavascriptFunction*,Memory::Recycler,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
              ((BaseDictionary<void*(*)(Js::RecyclableObject*,Js::CallInfo,___),Js::JavascriptFunction*,Memory::Recycler,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)this_01,(_func_void_ptr_RecyclableObject_ptr_CallInfo_varargs **)&data.line,
               (JavascriptFunction **)&entryPoint_local);
  }
  return;
}

Assistant:

void ScriptContext::SetBuiltInLibraryFunction(JavascriptMethod entryPoint, JavascriptFunction* function)
    {
        if (!isClosed)
        {
            if (builtInLibraryFunctions == NULL)
            {
                Assert(this->recycler);

                builtInLibraryFunctions = RecyclerNew(this->recycler, BuiltInLibraryFunctionMap, this->recycler, 131);
                Cache()->builtInLibraryFunctions = builtInLibraryFunctions;
            }

            builtInLibraryFunctions->Item(entryPoint, function);
        }
    }